

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::StreamingListener::OnTestCaseStart(StreamingListener *this,TestCase *test_case)

{
  String local_58;
  string local_48;
  
  String::Format(&local_58,"event=TestCaseStart&name=%s\n",(test_case->name_).c_str_);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,local_58.c_str_,local_58.c_str_ + local_58.length_);
  Send(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.c_str_ != (char *)0x0) {
    operator_delete__(local_58.c_str_);
  }
  return;
}

Assistant:

void OnTestCaseStart(const TestCase& test_case) {
    Send(String::Format("event=TestCaseStart&name=%s\n", test_case.name()));
  }